

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O1

bool duckdb::BoundOrderModifier::Simplify
               (vector<duckdb::BoundOrderByNode,_true> *orders,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *groups)

{
  pointer puVar1;
  pointer pBVar2;
  pointer pBVar3;
  iterator iVar4;
  vector<duckdb::BoundOrderByNode,_true> *__range1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *target;
  pointer this;
  pointer pBVar5;
  bool bVar6;
  expression_set_t seen_expressions;
  key_type local_90;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_88;
  type local_70;
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  this = (groups->
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ).
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (groups->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this != puVar1) {
    do {
      local_90._M_data =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this);
      local_88.
      super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_68;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::Expression>,std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>,std::__detail::_Identity,duckdb::ExpressionEquality<duckdb::Expression>,duckdb::ExpressionHashFunction<duckdb::Expression>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::reference_wrapper<duckdb::Expression>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::Expression>,true>>>>
                ((_Hashtable<std::reference_wrapper<duckdb::Expression>,std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>,std::__detail::_Identity,duckdb::ExpressionEquality<duckdb::Expression>,duckdb::ExpressionHashFunction<duckdb::Expression>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&local_90,&local_88);
      this = this + 1;
    } while (this != puVar1);
  }
  local_88.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar5 = (orders->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (orders->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar5 != pBVar2) {
    do {
      local_90._M_data =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&pBVar5->expression);
      iVar4 = ::std::
              _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&local_68,&local_90);
      if (iVar4.super__Node_iterator_base<std::reference_wrapper<duckdb::Expression>,_true>._M_cur
          == (__node_type *)0x0) {
        local_70 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(&pBVar5->expression);
        local_90._M_data = (type)&local_68;
        ::std::
        _Hashtable<std::reference_wrapper<duckdb::Expression>,std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>,std::__detail::_Identity,duckdb::ExpressionEquality<duckdb::Expression>,duckdb::ExpressionHashFunction<duckdb::Expression>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::reference_wrapper<duckdb::Expression>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::Expression>,true>>>>
                  ((_Hashtable<std::reference_wrapper<duckdb::Expression>,std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>,std::__detail::_Identity,duckdb::ExpressionEquality<duckdb::Expression>,duckdb::ExpressionHashFunction<duckdb::Expression>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_68,&local_70,&local_90);
        ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
        emplace_back<duckdb::BoundOrderByNode>(&local_88,pBVar5);
      }
      pBVar5 = pBVar5 + 1;
    } while (pBVar5 != pBVar2);
  }
  pBVar5 = (orders->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (orders->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  pBVar2 = (orders->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (orders->
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (orders->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (orders->super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>).
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  bVar6 = local_88.
          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_88.
          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_88.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_start = pBVar2;
  local_88.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = pBVar3;
  local_88.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pBVar5;
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&local_88);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::reference_wrapper<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>,_std::__detail::_Identity,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return bVar6;
}

Assistant:

bool BoundOrderModifier::Simplify(vector<BoundOrderByNode> &orders, const vector<unique_ptr<Expression>> &groups) {
	// for each ORDER BY - check if it is actually necessary
	// expressions that are in the groups do not need to be ORDERED BY
	// `ORDER BY` on a group has no effect, because for each aggregate, the group is unique
	// similarly, we only need to ORDER BY each aggregate once
	expression_set_t seen_expressions;
	for (auto &target : groups) {
		seen_expressions.insert(*target);
	}
	vector<BoundOrderByNode> new_order_nodes;
	for (auto &order_node : orders) {
		if (seen_expressions.find(*order_node.expression) != seen_expressions.end()) {
			// we do not need to order by this node
			continue;
		}
		seen_expressions.insert(*order_node.expression);
		new_order_nodes.push_back(std::move(order_node));
	}
	orders.swap(new_order_nodes);

	return orders.empty(); // NOLINT
}